

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O3

void __thiscall
tchecker::details::
lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::visit(lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
        *this,typed_array_expression_t *expr)

{
  expression_type_t eVar1;
  int iVar2;
  typed_var_expression_t *ptVar3;
  typed_expression_t *ptVar4;
  pointer plVar5;
  iterator iVar6;
  vector<long,_std::allocator<long>_> *pvVar7;
  ulong uVar8;
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  rvalue_expression_compiler;
  ulong local_60;
  undefined **local_58;
  vector<long,_std::allocator<long>_> *local_50;
  string local_48;
  
  eVar1 = (expr->super_typed_lvalue_expression_t).super_typed_expression_t._type;
  if ((EXPR_TYPE_CLKLVALUE < eVar1) ||
     ((0x4c0U >> (eVar1 & (EXPR_TYPE_CONJUNCTIVE_FORMULA|EXPR_TYPE_CLKCONSTR_DIAGONAL)) & 1) == 0))
  {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"a lvalue","");
    invalid_expression(this,(typed_expression_t *)expr,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  ptVar3 = typed_array_expression_t::variable(expr);
  uVar8 = (ulong)ptVar3->_id;
  ptVar3 = typed_array_expression_t::variable(expr);
  iVar2 = (**(code **)(*(long *)&(ptVar3->super_typed_lvalue_expression_t).super_typed_expression_t
                      + 0x38))(ptVar3);
  pvVar7 = (this->_bytecode_back_inserter).container;
  local_58 = &PTR__typed_expression_visitor_t_002156e8;
  local_60 = 5;
  iVar6._M_current =
       (pvVar7->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  plVar5 = (pvVar7->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
  local_50 = pvVar7;
  if (iVar6._M_current == plVar5) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (pvVar7,iVar6,(long *)&local_60);
    pvVar7 = (this->_bytecode_back_inserter).container;
    iVar6._M_current =
         (pvVar7->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    plVar5 = (pvVar7->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar6._M_current = 5;
    iVar6._M_current = iVar6._M_current + 1;
    (pvVar7->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar6._M_current;
  }
  if (iVar6._M_current == plVar5) {
    local_60 = uVar8;
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (pvVar7,iVar6,(long *)&local_60);
  }
  else {
    *iVar6._M_current = uVar8;
    (pvVar7->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar6._M_current + 1;
    local_60 = uVar8;
  }
  ptVar4 = typed_array_expression_t::offset(expr);
  (**(code **)(*(long *)ptVar4 + 0x30))(ptVar4,&local_58);
  local_60 = 2;
  pvVar7 = (this->_bytecode_back_inserter).container;
  iVar6._M_current =
       (pvVar7->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  plVar5 = (pvVar7->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
  if (iVar6._M_current == plVar5) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (pvVar7,iVar6,(long *)&local_60);
    pvVar7 = (this->_bytecode_back_inserter).container;
    iVar6._M_current =
         (pvVar7->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    plVar5 = (pvVar7->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar6._M_current = 2;
    iVar6._M_current = iVar6._M_current + 1;
    (pvVar7->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar6._M_current;
  }
  local_60 = 0;
  if (iVar6._M_current == plVar5) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (pvVar7,iVar6,(long *)&local_60);
    pvVar7 = (this->_bytecode_back_inserter).container;
    iVar6._M_current =
         (pvVar7->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    plVar5 = (pvVar7->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar6._M_current = 0;
    iVar6._M_current = iVar6._M_current + 1;
    (pvVar7->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar6._M_current;
  }
  local_60 = (ulong)(iVar2 - 1);
  if (iVar6._M_current == plVar5) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (pvVar7,iVar6,(long *)&local_60);
    pvVar7 = (this->_bytecode_back_inserter).container;
    iVar6._M_current =
         (pvVar7->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    plVar5 = (pvVar7->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar6._M_current = local_60;
    iVar6._M_current = iVar6._M_current + 1;
    (pvVar7->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar6._M_current;
  }
  local_60 = 0x13;
  if (iVar6._M_current == plVar5) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (pvVar7,iVar6,(long *)&local_60);
  }
  else {
    *iVar6._M_current = 0x13;
    (pvVar7->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar6._M_current + 1;
  }
  return;
}

Assistant:

virtual void visit(tchecker::typed_array_expression_t const & expr)
  {
    if ((expr.type() != tchecker::EXPR_TYPE_CLKLVALUE) && (expr.type() != tchecker::EXPR_TYPE_INTLVALUE) &&
        (expr.type() != tchecker::EXPR_TYPE_LOCALINTLVALUE))
      invalid_expression(expr, "a lvalue");

    // offset bounds
    auto const id = expr.variable().id();
    auto const lowoffset = 0;
    auto const highoffset = expr.variable().size() - 1;

    // Write bytecode
    tchecker::details::rvalue_expression_compiler_t<BYTECODE_BACK_INSERTER> rvalue_expression_compiler(_bytecode_back_inserter);

    _bytecode_back_inserter = tchecker::VM_PUSH;
    _bytecode_back_inserter = id;
    expr.offset().visit(rvalue_expression_compiler);
    _bytecode_back_inserter = tchecker::VM_FAILNOTIN;
    _bytecode_back_inserter = lowoffset;
    _bytecode_back_inserter = highoffset;
    _bytecode_back_inserter = tchecker::VM_SUM;
  }